

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_mutable_descriptor_type
          (Impl *this,Value *state,VkMutableDescriptorTypeCreateInfoEXT **out_info)

{
  uint uVar1;
  uint uVar2;
  VkMutableDescriptorTypeCreateInfoEXT *pVVar3;
  Number NVar4;
  Type this_00;
  VkMutableDescriptorTypeListEXT *__s;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  VkDescriptorType *pVVar5;
  ValueIterator pGVar6;
  ulong uVar7;
  size_t size;
  ValueIterator pGVar8;
  undefined8 local_38;
  
  pVVar3 = (VkMutableDescriptorTypeCreateInfoEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar3 != (VkMutableDescriptorTypeCreateInfoEXT *)0x0) {
    *(undefined8 *)&pVVar3->mutableDescriptorTypeListCount = 0;
    pVVar3->pMutableDescriptorTypeLists = (VkMutableDescriptorTypeListEXT *)0x0;
    *(undefined8 *)pVVar3 = 0;
    pVVar3->pNext = (void *)0x0;
  }
  *out_info = pVVar3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffc8,(Ch *)state);
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (local_38 != NVar4.i64) {
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"mutableDescriptorTypeLists");
    if ((this_00->data_).f.flags != 4) {
LAB_001273a0:
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x670,
                    "bool rapidjson::GenericValue<rapidjson::UTF8<>>::Empty() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    uVar1 = (this_00->data_).s.length;
    if ((ulong)uVar1 != 0) {
      size = (ulong)uVar1 << 4;
      __s = (VkMutableDescriptorTypeListEXT *)
            ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
      if (__s != (VkMutableDescriptorTypeListEXT *)0x0) {
        memset(__s,0,size);
      }
      pVVar3->mutableDescriptorTypeListCount = uVar1;
      pVVar3->pMutableDescriptorTypeLists = __s;
      uVar7 = 0;
      do {
        this_01 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this_00,(SizeType)uVar7);
        if ((this_01->data_).f.flags != 4) {
          __assert_fail("IsArray()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x66a,
                        "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        uVar2 = (this_01->data_).s.length;
        __s[uVar7].descriptorTypeCount = uVar2;
        if ((this_01->data_).f.flags != 4) goto LAB_001273a0;
        if ((this_01->data_).s.length != 0) {
          if ((ulong)uVar2 == 0) {
            pVVar5 = (VkDescriptorType *)0x0;
          }
          else {
            pVVar5 = (VkDescriptorType *)
                     ScratchAllocator::allocate_raw(&this->allocator,(ulong)uVar2 << 2,0x10);
          }
          __s[uVar7].pDescriptorTypes = pVVar5;
          if ((this_01->data_).f.flags != 4) {
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x68c,
                          "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          pGVar8 = (ValueIterator)((ulong)(this_01->data_).s.str & 0xffffffffffff);
          pGVar6 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::End(this_01);
          if (pGVar6 != pGVar8) {
            do {
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000) ==
                  (undefined1  [16])0x0) {
                __assert_fail("data_.f.flags & kUintFlag",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                              ,0x719,
                              "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                             );
              }
              *pVVar5 = (pGVar8->data_).s.length;
              pVVar5 = pVVar5 + 1;
              pGVar8 = pGVar8 + 1;
              pGVar6 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::End(this_01);
            } while (pGVar8 != pGVar6);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1 + (uVar1 == 0));
    }
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_mutable_descriptor_type(const Value &state,
                                                        VkMutableDescriptorTypeCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkMutableDescriptorTypeCreateInfoEXT>();
	*out_info = info;

	if (!state.HasMember("mutableDescriptorTypeLists"))
		return true;

	auto &lists = state["mutableDescriptorTypeLists"];
	if (lists.Empty())
		return true;

	auto out_count = lists.Size();
	auto *out_lists = allocator.allocate_n_cleared<VkMutableDescriptorTypeListEXT>(out_count);

	info->mutableDescriptorTypeListCount = out_count;
	info->pMutableDescriptorTypeLists = out_lists;

	for (uint32_t i = 0; i < out_count; i++)
	{
		auto &list = lists[i];
		auto list_count = list.Size();
		out_lists[i].descriptorTypeCount = list_count;

		if (!list.Empty())
		{
			auto *desc_types = allocator.allocate_n<VkDescriptorType>(list_count);
			out_lists[i].pDescriptorTypes = desc_types;
			for (auto itr = list.Begin(); itr != list.End(); ++itr)
				*desc_types++ = static_cast<VkDescriptorType>(itr->GetUint());
		}
	}

	return true;
}